

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

SizeAlignment __thiscall
dxil_spv::Converter::Impl::get_physical_size_for_type(Impl *this,Id type_id)

{
  Op OVar1;
  int iVar2;
  uint uVar3;
  Id IVar4;
  int iVar5;
  Builder *pBVar6;
  SizeAlignment SVar7;
  ulong uVar8;
  ulong uVar9;
  int member;
  
  pBVar6 = SPIRVModule::get_builder(this->spirv_module);
  OVar1 = (pBVar6->module).idToInstruction.
          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start[type_id]->opCode;
  pBVar6 = SPIRVModule::get_builder(this->spirv_module);
  if (OVar1 - OpTypeBool < 3) {
    iVar2 = spv::Builder::getScalarTypeWidth(pBVar6,type_id);
    iVar5 = iVar2 + 7;
    if (-1 < iVar2) {
      iVar5 = iVar2;
    }
    uVar3 = iVar5 >> 3;
LAB_0011bc67:
    uVar8 = (ulong)uVar3;
  }
  else {
    OVar1 = (pBVar6->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start[type_id]->opCode;
    pBVar6 = SPIRVModule::get_builder(this->spirv_module);
    if (OVar1 == OpTypeVector) {
      IVar4 = spv::Builder::getContainedTypeId(pBVar6,type_id);
      SVar7 = get_physical_size_for_type(this,IVar4);
      pBVar6 = SPIRVModule::get_builder(this->spirv_module);
      type_id = (pBVar6->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start[type_id]->typeId;
    }
    else {
      OVar1 = (pBVar6->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start[type_id]->opCode;
      pBVar6 = SPIRVModule::get_builder(this->spirv_module);
      if ((OVar1 & ~OpUndef) != OpTypeArray) {
        OVar1 = (pBVar6->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start[type_id]->opCode;
        pBVar6 = SPIRVModule::get_builder(this->spirv_module);
        if (OVar1 == OpTypeStruct) {
          iVar5 = spv::Builder::getNumTypeConstituents(pBVar6,type_id);
          if (iVar5 < 1) {
            uVar8 = 0;
            iVar2 = -1;
          }
          else {
            member = 0;
            iVar2 = 0;
            uVar9 = 0;
            do {
              pBVar6 = SPIRVModule::get_builder(this->spirv_module);
              IVar4 = spv::Builder::getContainedTypeId(pBVar6,type_id,member);
              SVar7 = get_physical_size_for_type(this,IVar4);
              uVar3 = SVar7.alignment;
              iVar2 = (-uVar3 & (uVar3 + iVar2) - 1) + SVar7.size;
              uVar8 = (ulong)SVar7 >> 0x20;
              if (uVar3 < (uint)uVar9) {
                uVar8 = uVar9;
              }
              member = member + 1;
              uVar9 = uVar8;
            } while (iVar5 != member);
            iVar2 = iVar2 + -1;
          }
          uVar3 = -(int)uVar8 & iVar2 + (int)uVar8;
          goto LAB_0011bd1e;
        }
        uVar3 = (uint)((pBVar6->module).idToInstruction.
                       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[type_id]->opCode == OpTypePointer)
                << 3;
        goto LAB_0011bc67;
      }
      IVar4 = spv::Builder::getContainedTypeId(pBVar6,type_id);
      SVar7 = get_physical_size_for_type(this,IVar4);
      pBVar6 = SPIRVModule::get_builder(this->spirv_module);
    }
    uVar8 = (ulong)SVar7 >> 0x20;
    iVar5 = spv::Builder::getNumTypeConstituents(pBVar6,type_id);
    uVar3 = iVar5 * SVar7.size;
  }
LAB_0011bd1e:
  return (SizeAlignment)((ulong)uVar3 | uVar8 << 0x20);
}

Assistant:

Converter::Impl::SizeAlignment Converter::Impl::get_physical_size_for_type(spv::Id type_id)
{
	SizeAlignment res = {};

	if (builder().isScalarType(type_id))
	{
		res.size = builder().getScalarTypeWidth(type_id) / 8;
		res.alignment = res.size;
	}
	else if (builder().isVectorType(type_id))
	{
		res = get_physical_size_for_type(builder().getContainedTypeId(type_id));
		res.size *= builder().getNumComponents(type_id);
	}
	else if (builder().isArrayType(type_id))
	{
		res = get_physical_size_for_type(builder().getContainedTypeId(type_id));
		uint32_t array_size = builder().getNumTypeConstituents(type_id);
		// Alignment is inherited from constituent, we do scalar block layout here.
		res.size *= array_size;
	}
	else if (builder().isStructType(type_id))
	{
		int num_members = builder().getNumTypeConstituents(type_id);
		for (int i = 0; i < num_members; i++)
		{
			uint32_t member_type_id = builder().getContainedTypeId(type_id, i);
			auto member_res = get_physical_size_for_type(member_type_id);
			res.size = (res.size + member_res.alignment - 1) & ~(member_res.alignment - 1);
			res.size += member_res.size;
			res.alignment = std::max<uint32_t>(res.alignment, member_res.alignment);
		}
		res.size = (res.size + res.alignment - 1) & ~(res.alignment - 1);
	}
	else if (builder().isPointerType(type_id))
	{
		res.size = sizeof(uint64_t);
		res.alignment = sizeof(uint64_t);
	}

	return res;
}